

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_opt_step_adamw(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  size_t sVar13;
  long lVar14;
  size_t sVar15;
  size_t sVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  char cVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  uint *puVar28;
  long lVar29;
  long lVar30;
  char *pcVar31;
  long lVar32;
  int iVar33;
  undefined8 uVar34;
  long lVar35;
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [64];
  
  pgVar8 = dst->src[0];
  if (pgVar8->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x2266,"fatal error");
  }
  pgVar9 = dst->src[1];
  pgVar10 = dst->src[3];
  pgVar11 = dst->src[2];
  pgVar12 = dst->src[4];
  cVar23 = ggml_are_same_shape(pgVar8,pgVar9);
  if (cVar23 == '\0') {
    pcVar31 = "ggml_are_same_shape(src0, src0_grad)";
    uVar34 = 0x2221;
  }
  else {
    cVar23 = ggml_are_same_shape(pgVar8,pgVar11);
    if (cVar23 == '\0') {
      pcVar31 = "ggml_are_same_shape(src0, src0_grad_m)";
      uVar34 = 0x2222;
    }
    else {
      cVar23 = ggml_are_same_shape(pgVar8,pgVar10);
      if (cVar23 == '\0') {
        pcVar31 = "ggml_are_same_shape(src0, src0_grad_v)";
        uVar34 = 0x2223;
      }
      else {
        lVar27 = ggml_nelements(pgVar12);
        if (lVar27 == 7) {
          iVar33 = params->ith;
          iVar7 = params->nth;
          iVar24 = ggml_nrows(pgVar8);
          if (pgVar8->nb[0] == 4) {
            lVar27 = pgVar8->ne[1];
            lVar30 = pgVar8->ne[2];
            sVar13 = pgVar8->nb[3];
            lVar14 = pgVar8->ne[0];
            sVar15 = pgVar8->nb[1];
            sVar16 = pgVar8->nb[2];
            iVar25 = iVar7 + -1 + iVar24;
            iVar26 = iVar25 / iVar7;
            iVar33 = iVar33 * iVar26;
            iVar26 = iVar26 + iVar33;
            if (iVar24 <= iVar26) {
              iVar26 = iVar24;
            }
            puVar28 = (uint *)ggml_get_data_f32(pgVar12,sVar16,
                                                (long)iVar25 % (long)iVar7 & 0xffffffff);
            if (iVar33 < iVar26) {
              fVar1 = (float)puVar28[1];
              fVar2 = (float)puVar28[2];
              fVar3 = (float)puVar28[3];
              fVar4 = (float)puVar28[5];
              fVar5 = (float)puVar28[6];
              lVar30 = lVar30 * lVar27;
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar36 = vxorps_avx512vl(ZEXT416(*puVar28),auVar22);
              auVar22 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416(*puVar28),
                                         ZEXT416(puVar28[4]));
              auVar38 = ZEXT1664(auVar22);
              lVar29 = (long)iVar33;
              do {
                lVar32 = lVar29 % lVar30;
                if (0 < lVar14) {
                  lVar35 = 0;
                  pvVar17 = pgVar10->data;
                  lVar32 = (lVar32 % lVar27) * sVar15 + (lVar29 / lVar30) * sVar13 +
                           (lVar32 / lVar27) * sVar16;
                  pvVar18 = pgVar8->data;
                  pvVar19 = pgVar9->data;
                  pvVar20 = pgVar11->data;
                  do {
                    auVar21 = vfmadd231ss_fma(ZEXT416((uint)((1.0 - fVar1) *
                                                            *(float *)((long)pvVar19 +
                                                                      lVar35 * 4 + lVar32))),
                                              ZEXT416((uint)fVar1),
                                              ZEXT416(*(uint *)((long)pvVar20 + lVar35 * 4 + lVar32)
                                                     ));
                    *(int *)((long)pvVar20 + lVar35 * 4 + lVar32) = auVar21._0_4_;
                    fVar6 = *(float *)((long)pvVar19 + lVar35 * 4 + lVar32);
                    auVar21 = vfmadd231ss_fma(ZEXT416((uint)((1.0 - fVar2) * fVar6 * fVar6)),
                                              ZEXT416((uint)fVar2),
                                              ZEXT416(*(uint *)((long)pvVar17 + lVar35 * 4 + lVar32)
                                                     ));
                    *(float *)((long)pvVar17 + lVar35 * 4 + lVar32) = auVar21._0_4_;
                    fVar37 = fVar5 * auVar21._0_4_;
                    fVar6 = *(float *)((long)pvVar20 + lVar35 * 4 + lVar32);
                    if (fVar37 < 0.0) {
                      fVar37 = sqrtf(fVar37);
                      auVar38 = ZEXT464(auVar22._0_4_);
                    }
                    else {
                      auVar21 = vsqrtss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
                      fVar37 = auVar21._0_4_;
                    }
                    auVar21 = vfmadd231ss_fma(ZEXT416((uint)((auVar36._0_4_ * fVar4 * fVar6) /
                                                            (fVar3 + fVar37))),auVar38._0_16_,
                                              ZEXT416(*(uint *)((long)pvVar18 + lVar35 * 4 + lVar32)
                                                     ));
                    *(int *)((long)pvVar18 + lVar35 * 4 + lVar32) = auVar21._0_4_;
                    lVar35 = lVar35 + 1;
                  } while (lVar14 != lVar35);
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 != iVar26);
            }
            return;
          }
          pcVar31 = "nb00 == sizeof(float)";
          uVar34 = 0x222c;
        }
        else {
          pcVar31 = "ggml_nelements(adamw_params) == 7";
          uVar34 = 0x2224;
        }
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar34,"GGML_ASSERT(%s) failed",pcVar31);
}

Assistant:

void ggml_compute_forward_opt_step_adamw(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_opt_step_adamw_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}